

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

VertexWeightTable * Assimp::ComputeVertexBoneWeightTable(aiMesh *pMesh)

{
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *this;
  aiBone *paVar1;
  iterator __position;
  ulong *puVar2;
  VertexWeightTable *__s;
  ulong uVar3;
  ulong uVar4;
  pair<unsigned_int,_float> local_38;
  
  if (((pMesh == (aiMesh *)0x0) || (pMesh->mNumVertices == 0)) || (pMesh->mNumBones == 0)) {
    __s = (VertexWeightTable *)0x0;
  }
  else {
    uVar4 = (ulong)pMesh->mNumVertices;
    puVar2 = (ulong *)operator_new__(uVar4 * 0x18 + 8);
    *puVar2 = uVar4;
    __s = (VertexWeightTable *)(puVar2 + 1);
    memset(__s,0,((uVar4 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    if (pMesh->mNumBones != 0) {
      uVar4 = 0;
      do {
        paVar1 = pMesh->mBones[uVar4];
        if (paVar1->mNumWeights != 0) {
          uVar3 = 0;
          do {
            this = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    *)(__s + paVar1->mWeights[uVar3].mVertexId);
            local_38.second = paVar1->mWeights[uVar3].mWeight;
            local_38.first = (uint)uVar4;
            __position._M_current = *(pair<unsigned_int,_float> **)(this + 8);
            if (__position._M_current == *(pair<unsigned_int,_float> **)(this + 0x10)) {
              std::
              vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
              _M_realloc_insert<std::pair<unsigned_int,float>>(this,__position,&local_38);
            }
            else {
              *__position._M_current = local_38;
              *(long *)(this + 8) = *(long *)(this + 8) + 8;
            }
            uVar3 = uVar3 + 1;
          } while (uVar3 < paVar1->mNumWeights);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < pMesh->mNumBones);
    }
  }
  return __s;
}

Assistant:

VertexWeightTable* ComputeVertexBoneWeightTable(const aiMesh* pMesh)
{
    if (!pMesh || !pMesh->mNumVertices || !pMesh->mNumBones) {
        return NULL;
    }

    VertexWeightTable* avPerVertexWeights = new VertexWeightTable[pMesh->mNumVertices];
    for (unsigned int i = 0; i < pMesh->mNumBones;++i)  {

        aiBone* bone = pMesh->mBones[i];
        for (unsigned int a = 0; a < bone->mNumWeights;++a) {
            const aiVertexWeight& weight = bone->mWeights[a];
            avPerVertexWeights[weight.mVertexId].push_back( std::pair<unsigned int,float>(i,weight.mWeight) );
        }
    }
    return avPerVertexWeights;
}